

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O2

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
          (QControlledGate2<std::complex<float>_> *this)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  complex<float> in_RCX;
  complex<float> m01;
  data_type extraout_RDX;
  long *in_RSI;
  complex<float> m00;
  complex<float> in_R8;
  data_type *this_00;
  SquareMatrix<std::complex<float>_> SVar4;
  SquareMatrix<std::complex<float>_> SStack_a8;
  matrix_type CG;
  matrix_type E1;
  matrix_type E0;
  matrix_type I2;
  SquareMatrix<std::complex<float>_> local_58;
  SquareMatrix<std::complex<float>_> local_48;
  SquareMatrix<std::complex<float>_> local_38;
  SquareMatrix<std::complex<float>_> local_28;
  
  m00._M_value = 2;
  SVar4 = dense::eye<std::complex<float>>((int64_t)&I2);
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&E0,m00,(complex<float>)
                     SVar4.data_._M_t.
                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl._M_t,in_RCX,
             in_R8);
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&E1,m00,m01,in_RCX,in_R8);
  plVar3 = (long *)(**(code **)(*in_RSI + 0x80))();
  (**(code **)(*plVar3 + 0x38))(&CG,plVar3);
  lVar1 = in_RSI[1];
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar1 < iVar2) {
      dense::kron<std::complex<float>>((dense *)&local_28,&E0,&CG);
      dense::kron<std::complex<float>>((dense *)&SStack_a8,&E1,&I2);
      dense::operator+((dense *)this,&local_28,&SStack_a8);
      this_00 = &local_28.data_;
    }
    else {
      dense::kron<std::complex<float>>((dense *)&local_38,&CG,&E0);
      dense::kron<std::complex<float>>((dense *)&SStack_a8,&I2,&E1);
      dense::operator+((dense *)this,&local_38,&SStack_a8);
      this_00 = &local_38.data_;
    }
  }
  else {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar1 < iVar2) {
      dense::kron<std::complex<float>>((dense *)&local_48,&E0,&I2);
      dense::kron<std::complex<float>>((dense *)&SStack_a8,&E1,&CG);
      dense::operator+((dense *)this,&local_48,&SStack_a8);
      this_00 = &local_48.data_;
    }
    else {
      dense::kron<std::complex<float>>((dense *)&local_58,&I2,&E0);
      dense::kron<std::complex<float>>((dense *)&SStack_a8,&CG,&E1);
      dense::operator+((dense *)this,&local_58,&SStack_a8);
      this_00 = &local_58.data_;
    }
  }
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&SStack_a8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (this_00);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&CG.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&E1.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&E0.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&I2.data_);
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }